

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

void __thiscall
BoardView::DrawDiamond(BoardView *this,ImDrawList *draw,ImVec2 c,double r,uint32_t color)

{
  undefined8 in_XMM0_Qa;
  double in_XMM1_Qa;
  ImVec2 dia [4];
  float in_stack_00000208;
  ImDrawFlags in_stack_0000020c;
  ImU32 in_stack_00000210;
  int in_stack_00000214;
  ImVec2 *in_stack_00000218;
  ImDrawList *in_stack_00000220;
  ImVec2 *local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 IStack_28;
  double local_20;
  undefined8 local_8;
  
  local_70 = &local_48;
  local_20 = in_XMM1_Qa;
  local_8 = in_XMM0_Qa;
  do {
    ImVec2::ImVec2(local_70);
    local_70 = local_70 + 1;
  } while (local_70 != &IStack_28);
  ImVec2::ImVec2(&local_50,(float)local_8,(float)((double)local_8._4_4_ - local_20));
  local_48 = local_50;
  ImVec2::ImVec2(&local_58,(float)((double)(float)local_8 + local_20),local_8._4_4_);
  local_40 = local_58;
  ImVec2::ImVec2(&local_60,(float)local_8,(float)((double)local_8._4_4_ + local_20));
  local_38 = local_60;
  ImVec2::ImVec2(&local_68,(float)((double)(float)local_8 - local_20),local_8._4_4_);
  local_30 = local_68;
  ImDrawList::AddPolyline
            (in_stack_00000220,in_stack_00000218,in_stack_00000214,in_stack_00000210,
             in_stack_0000020c,in_stack_00000208);
  return;
}

Assistant:

void BoardView::DrawDiamond(ImDrawList *draw, ImVec2 c, double r, uint32_t color) {
	ImVec2 dia[4];

	dia[0] = ImVec2(c.x, c.y - r);
	dia[1] = ImVec2(c.x + r, c.y);
	dia[2] = ImVec2(c.x, c.y + r);
	dia[3] = ImVec2(c.x - r, c.y);

	draw->AddPolyline(dia, 4, color, true, 1.0f);
}